

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

void __thiscall Reducer::reduceUsingPasses(Reducer *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  pointer *__return_storage_ptr___00;
  undefined4 uVar1;
  pointer pbVar2;
  bool bVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [8];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200;
  string local_1e0;
  string local_1c0 [32];
  string local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pass;
  undefined1 local_e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passes;
  undefined1 local_88 [8];
  string currCommand;
  allocator<char> local_54;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator_type local_35;
  uint local_34;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_6c0,"-Oz",(allocator<char> *)local_120);
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"-Os",(allocator<char> *)local_88);
  std::__cxx11::string::string<std::allocator<char>>
            (local_680,"-O1",
             (allocator<char> *)
             &passes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string<std::allocator<char>>
            (local_660,"-O2",(allocator<char> *)(pass.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>(local_640,"-O3",(allocator<char> *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>(local_620,"-O4",(allocator<char> *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            (local_600,"--flatten -Os",(allocator<char> *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,"--flatten -O3",&local_54);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5c0,"--flatten --simplify-locals-notee-nostructure --local-cse -Os",&local_53);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5a0,"--type-ssa -Os --type-merging",&local_52);
  std::__cxx11::string::string<std::allocator<char>>(local_580,"--gufa -O1",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            (local_560,"--coalesce-locals --vacuum",&local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_540,"--dae",&local_4f);
  std::__cxx11::string::string<std::allocator<char>>(local_520,"--dae-optimizing",&local_4e);
  std::__cxx11::string::string<std::allocator<char>>(local_500,"--dce",&local_4d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4e0,"--duplicate-function-elimination",&local_4c);
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"--enclose-world",&local_4b);
  std::__cxx11::string::string<std::allocator<char>>(local_4a0,"--gto",&local_4a);
  std::__cxx11::string::string<std::allocator<char>>(local_480,"--inlining",&local_49);
  std::__cxx11::string::string<std::allocator<char>>(local_460,"--inlining-optimizing",&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            (local_440,"--optimize-level=3 --inlining-optimizing",&local_47);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"--local-cse",&local_46);
  std::__cxx11::string::string<std::allocator<char>>(local_400,"--memory-packing",&local_45);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3e0,"--remove-unused-names --merge-blocks --vacuum",&local_44);
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"--optimize-instructions",&local_43);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"--precompute",&local_42);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"--remove-imports",&local_41);
  std::__cxx11::string::string<std::allocator<char>>(local_360,"--remove-memory-init",&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            (local_340,"--remove-unused-names --remove-unused-brs",&local_3f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_320,"--remove-unused-module-elements",&local_3e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_300,"--remove-unused-nonfunction-module-elements",&local_3d);
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"--reorder-functions",&local_3c);
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"--reorder-locals",&local_3b);
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"--simplify-globals",&local_3a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_280,"--simplify-locals --vacuum",&local_39);
  std::__cxx11::string::string<std::allocator<char>>(local_260,"--strip",&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            (local_240,"--remove-unused-types --closed-world",&local_37);
  std::__cxx11::string::string<std::allocator<char>>(local_220,"--vacuum",&local_36);
  __l._M_len = 0x26;
  __l._M_array = (iterator)local_6c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e0,__l,&local_35);
  lVar6 = 0x4a0;
  do {
    std::__cxx11::string::~string((string *)(local_6c0 + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::string(local_1a0,(string *)&this->working);
  currCommand.field_2._8_8_ = wasm::file_size(local_1a0);
  std::__cxx11::string::~string(local_1a0);
  local_34 = (uint)CONCAT71((int7)((ulong)&this->command >> 8),1);
  while (pbVar2 = passes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, (local_34 & 1) != 0) {
    local_34 = 0;
    for (auVar7 = local_e0; auVar7 != (undefined1  [8])pbVar2;
        auVar7 = (undefined1  [8])((long)auVar7 + 0x20)) {
      std::__cxx11::string::string((string *)local_120,(string *)auVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &passes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"wasm-opt",
                 (allocator<char> *)(pass.field_2._M_local_buf + 8));
      wasm::Path::getBinaryenBinaryTool((string *)local_6c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c0,
                     " ");
      std::__cxx11::string::~string((string *)local_6c0);
      std::__cxx11::string::~string
                ((string *)
                 &passes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_140,&this->working," -o ");
      std::operator+(&local_160,&local_140,&this->test);
      std::operator+(&local_180,&local_160," ");
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&pass.field_2 + 8);
      std::operator+(__return_storage_ptr__,&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120)
      ;
      __return_storage_ptr___00 =
           &passes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr___00,__return_storage_ptr__," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr___00,&extraFlags_abi_cxx11_);
      std::__cxx11::string::append((string *)local_88);
      std::__cxx11::string::~string((string *)local_6c0);
      std::__cxx11::string::~string
                ((string *)
                 &passes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)(pass.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_140);
      if (this->binary == false) {
        std::__cxx11::string::append(local_88);
      }
      if (this->verbose == true) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"|    trying pass command: ");
        poVar4 = std::operator<<(poVar4,(string *)local_88);
        std::operator<<(poVar4,"\n");
      }
      std::__cxx11::string::string((string *)&local_200,(string *)local_88);
      ProgramResult::ProgramResult((ProgramResult *)local_6c0,&local_200);
      uVar1 = local_6c0._0_4_;
      std::__cxx11::string::~string((string *)(local_6c0 + 8));
      std::__cxx11::string::~string((string *)&local_200);
      if (uVar1 == 0) {
        std::__cxx11::string::string(local_1c0,(string *)&this->test);
        uVar5 = wasm::file_size(local_1c0);
        std::__cxx11::string::~string(local_1c0);
        if (uVar5 < (ulong)currCommand.field_2._8_8_) {
          std::__cxx11::string::string((string *)&local_1e0,(string *)&this->command);
          ProgramResult::ProgramResult((ProgramResult *)local_6c0,&local_1e0);
          bVar3 = ProgramResult::operator==((ProgramResult *)local_6c0,&expected);
          std::__cxx11::string::~string((string *)(local_6c0 + 8));
          std::__cxx11::string::~string((string *)&local_1e0);
          if (bVar3) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"|    command \"");
            poVar4 = std::operator<<(poVar4,(string *)local_88);
            poVar4 = std::operator<<(poVar4,"\" succeeded, reduced size to ");
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            poVar4 = std::operator<<(poVar4,'\n');
            local_34 = (uint)CONCAT71((int7)((ulong)poVar4 >> 8),1);
            applyTestToWorking(this);
            currCommand.field_2._8_8_ = uVar5;
          }
        }
      }
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::~string((string *)local_120);
    }
  }
  if (this->verbose == true) {
    std::operator<<((ostream *)&std::cerr,"|    done with passes for now\n");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e0);
  return;
}

Assistant:

void reduceUsingPasses() {
    // run optimization passes until we can't shrink it any more
    std::vector<std::string> passes = {
      // Optimization modes.
      "-Oz",
      "-Os",
      "-O1",
      "-O2",
      "-O3",
      "-O4",
      // Optimization modes + passes that work well with them.
      "--flatten -Os",
      "--flatten -O3",
      "--flatten --simplify-locals-notee-nostructure --local-cse -Os",
      "--type-ssa -Os --type-merging",
      "--gufa -O1",
      // Individual passes or combinations of them.
      "--coalesce-locals --vacuum",
      "--dae",
      "--dae-optimizing",
      "--dce",
      "--duplicate-function-elimination",
      "--enclose-world",
      "--gto",
      "--inlining",
      "--inlining-optimizing",
      "--optimize-level=3 --inlining-optimizing",
      "--local-cse",
      "--memory-packing",
      "--remove-unused-names --merge-blocks --vacuum",
      "--optimize-instructions",
      "--precompute",
      "--remove-imports",
      "--remove-memory-init",
      "--remove-unused-names --remove-unused-brs",
      "--remove-unused-module-elements",
      "--remove-unused-nonfunction-module-elements",
      "--reorder-functions",
      "--reorder-locals",
      // TODO: signature* passes
      "--simplify-globals",
      "--simplify-locals --vacuum",
      "--strip",
      "--remove-unused-types --closed-world",
      "--vacuum"};
    auto oldSize = file_size(working);
    bool more = true;
    while (more) {
      // std::cerr << "|    starting passes loop iteration\n";
      more = false;
      // try both combining with a generic shrink (so minor pass overhead is
      // compensated for), and without
      for (auto pass : passes) {
        std::string currCommand = Path::getBinaryenBinaryTool("wasm-opt") + " ";
        currCommand += working + " -o " + test + " " + pass + " " + extraFlags;
        if (!binary) {
          currCommand += " -S ";
        }
        if (verbose) {
          std::cerr << "|    trying pass command: " << currCommand << "\n";
        }
        if (!ProgramResult(currCommand).failed()) {
          auto newSize = file_size(test);
          if (newSize < oldSize) {
            // the pass didn't fail, and the size looks smaller, so promising
            // see if it is still has the property we are preserving
            if (ProgramResult(command) == expected) {
              std::cerr << "|    command \"" << currCommand
                        << "\" succeeded, reduced size to " << newSize << '\n';
              applyTestToWorking();
              more = true;
              oldSize = newSize;
            }
          }
        }
      }
    }
    if (verbose) {
      std::cerr << "|    done with passes for now\n";
    }
  }